

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

uint16_t toggle_modifiers_get_clean_mask(toggle_modifiers *modifiers,uint16_t mask)

{
  ushort uVar1;
  
  if (modifiers == (toggle_modifiers *)0x0) {
    uVar1 = 0xfffd;
  }
  else {
    uVar1 = ~(modifiers->caps_lock | modifiers->num_lock | modifiers->scroll_lock);
  }
  return uVar1 & mask;
}

Assistant:

ATTR_INLINE uint16_t toggle_modifiers_get_clean_mask(const struct toggle_modifiers *modifiers,
                                                     uint16_t mask)
{
        if (modifiers == NULL) {
                // Use simple clean mask if we were unable to resolve modifiers
                return (uint16_t)(mask & ~(XCB_MOD_MASK_LOCK));
        }

        uint16_t modifier_mask
                = (modifiers->num_lock | modifiers->caps_lock | modifiers->scroll_lock);

        return (uint16_t)(mask & ~(modifier_mask));
}